

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cpp
# Opt level: O1

AnalysisState __thiscall HttpData::analysisRequest(HttpData *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  string *this_01;
  char *pcVar2;
  size_t __n;
  bool bVar3;
  _Alloc_hider __n_00;
  uint uVar4;
  int iVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  void *pvVar9;
  pointer pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong uVar14;
  uint uVar15;
  AnalysisState AVar16;
  undefined8 uVar17;
  HttpData *pHVar18;
  element_type *peVar19;
  ulong uVar20;
  bool bVar21;
  size_type __dnew;
  string __str_1;
  string filetype;
  string header;
  string __str;
  stat sbuf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  ulong local_168;
  undefined1 local_160 [48];
  ulong local_130;
  key_type local_d0;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((this->method_ & ~METHOD_POST) != METHOD_GET) {
    return ANALYSIS_ERROR;
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_1a8,"HTTP/1.1 200 OK\r\n");
  pcVar2 = local_160 + 0x10;
  local_160._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"Connection","");
  this_00 = &this->headers_;
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_160);
  p_Var1 = &(this->headers_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
    bVar3 = false;
    bVar21 = false;
  }
  else {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Connection","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_d0);
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (pmVar7,"Keep-Alive");
    if (iVar5 == 0) {
      bVar21 = true;
      bVar3 = false;
    }
    else {
      local_50._M_allocated_capacity = (size_type)&local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_60 + 0x10),"Connection","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,(key_type *)(local_60 + 0x10));
      iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(pmVar7,"keep-alive");
      bVar21 = iVar5 == 0;
      bVar3 = true;
    }
  }
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_allocated_capacity != &local_40)) {
    operator_delete((void *)local_50._M_allocated_capacity,local_40._M_allocated_capacity + 1);
  }
  if (((_Rb_tree_header *)iVar6._M_node != p_Var1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2)) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_160._0_8_ != pcVar2) {
    operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
  }
  if (bVar21) {
    this->keepAlive_ = true;
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"Connection: Keep-Alive\r\n","");
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_1e8,"Keep-Alive: timeout=");
    paVar13 = &local_208.field_2;
    local_208._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar11 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p == paVar11) {
      local_208.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_208.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_208._M_dataplus._M_p = (pointer)paVar13;
    }
    else {
      local_208.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_208._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    paVar11 = &local_188.field_2;
    local_188._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_188,6,'-');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_188._M_dataplus._M_p,6,300000);
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar13) {
      uVar17 = local_208.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_188._M_string_length + local_208._M_string_length) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar11) {
        uVar17 = local_188.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_188._M_string_length + local_208._M_string_length)
      goto LAB_0010988c;
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_188,0,0,local_208._M_dataplus._M_p,local_208._M_string_length);
    }
    else {
LAB_0010988c:
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_208,local_188._M_dataplus._M_p,local_188._M_string_length);
    }
    local_1c8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar12 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p == paVar12) {
      local_1c8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_1c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    }
    else {
      local_1c8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    local_1c8._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar8->_M_string_length = 0;
    paVar12->_M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_1c8,"\r\n");
    local_160._0_8_ = (pbVar8->_M_dataplus)._M_p;
    paVar12 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._0_8_ == paVar12) {
      local_160._16_8_ = paVar12->_M_allocated_capacity;
      local_160._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_160._0_8_ = pcVar2;
    }
    else {
      local_160._16_8_ = paVar12->_M_allocated_capacity;
    }
    local_160._8_8_ = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_1a8,(char *)local_160._0_8_,local_160._8_8_);
    if ((char *)local_160._0_8_ != pcVar2) {
      operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar11) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar13) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  this_01 = &this->fileName_;
  __n = (this->fileName_)._M_string_length;
  uVar15 = 0xffffffff;
  if (__n != 0) {
    pcVar10 = (this_01->_M_dataplus)._M_p;
    pvVar9 = memchr(pcVar10,0x2e,__n);
    uVar15 = -(uint)(pvVar9 == (void *)0x0) | (int)pvVar9 - (int)pcVar10;
  }
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_allocated_capacity =
       local_1c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((int)uVar15 < 0) {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"default","");
    MimeType::getMime((string *)local_160,&local_208);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_1c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
    if ((char *)local_160._0_8_ != pcVar2) {
      operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) goto LAB_00109b16;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_208,this_01,(ulong)(uVar15 & 0x7fffffff),0xffffffffffffffff);
    MimeType::getMime((string *)local_160,&local_208);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_1c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
    if ((char *)local_160._0_8_ != pcVar2) {
      operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
LAB_00109b16:
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (this_01,"hello");
  if (iVar5 == 0) {
    AVar16 = ANALYSIS_SUCCESS;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&this->outBuffer_,0,(this->outBuffer_)._M_string_length,
               "HTTP/1.1 200 OK\r\nContent-type: text/plain\r\n\r\nHello World",0x38);
  }
  else {
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (this_01,"favicon.ico");
    if (iVar5 == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_1a8,"Content-Type: image/png\r\n");
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_1e8,3,'\0');
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_1e8._M_dataplus._M_p,(uint)local_1e8._M_string_length,0x22b);
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_1e8,0,0,"Content-Length: ",0x10);
      local_208._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar13 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p == paVar13) {
        local_208.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_208.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      }
      else {
        local_208.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_208._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_208,"\r\n");
      local_160._0_8_ = (pbVar8->_M_dataplus)._M_p;
      paVar13 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._0_8_ == paVar13) {
        local_160._16_8_ = paVar13->_M_allocated_capacity;
        local_160._24_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_160._0_8_ = pcVar2;
      }
      else {
        local_160._16_8_ = paVar13->_M_allocated_capacity;
      }
      local_160._8_8_ = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_1a8,(char *)local_160._0_8_,local_160._8_8_);
      if ((char *)local_160._0_8_ != pcVar2) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_1a8,"Server: LinYa\'s Web Server\r\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_1a8,"\r\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&this->outBuffer_,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
      local_208._M_dataplus._M_p = (pointer)0x22b;
      local_160._0_8_ = pcVar2;
      pcVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_160,(size_type *)&local_208,0);
      __n_00._M_p = local_208._M_dataplus._M_p;
      local_160._16_8_ = local_208._M_dataplus._M_p;
      local_160._0_8_ = pcVar10;
      memcpy(pcVar10,favicon,0x22b);
      local_160._8_8_ = __n_00._M_p;
      pcVar10[__n_00._M_p] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&this->outBuffer_,(char *)local_160._0_8_,(size_type)__n_00._M_p);
      if ((char *)local_160._0_8_ != pcVar2) {
        operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
      }
      AVar16 = ANALYSIS_SUCCESS;
    }
    else {
      iVar5 = stat((this_01->_M_dataplus)._M_p,(stat *)local_160);
      if (iVar5 < 0) {
        local_1a8._M_string_length = 0;
        *local_1a8._M_dataplus._M_p = '\0';
        iVar5 = this->fd_;
        pHVar18 = (HttpData *)local_70;
        local_70._0_8_ = (element_type *)local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)pHVar18,"Not Found!","");
        handleError(pHVar18,iVar5,0x194,(string *)local_70);
        AVar16 = ANALYSIS_ERROR;
        peVar19 = (element_type *)local_70._0_8_;
        if ((element_type *)local_70._0_8_ == (element_type *)local_60) goto LAB_0010a2b3;
      }
      else {
        std::operator+(&local_1e8,"Content-Type: ",&local_1c8);
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_1e8,"\r\n");
        local_208._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
        paVar13 = &pbVar8->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p == paVar13) {
          local_208.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_208.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        }
        else {
          local_208.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        }
        local_208._M_string_length = pbVar8->_M_string_length;
        (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
        pbVar8->_M_string_length = 0;
        (pbVar8->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        uVar20 = -local_130;
        if (0 < (long)local_130) {
          uVar20 = local_130;
        }
        uVar15 = 1;
        if (9 < uVar20) {
          uVar14 = uVar20;
          uVar4 = 4;
          do {
            uVar15 = uVar4;
            if (uVar14 < 100) {
              uVar15 = uVar15 - 2;
              goto LAB_00109f71;
            }
            if (uVar14 < 1000) {
              uVar15 = uVar15 - 1;
              goto LAB_00109f71;
            }
            if (uVar14 < 10000) goto LAB_00109f71;
            bVar3 = 99999 < uVar14;
            uVar14 = uVar14 / 10000;
            uVar4 = uVar15 + 4;
          } while (bVar3);
          uVar15 = uVar15 + 1;
        }
LAB_00109f71:
        local_168 = local_130;
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct(&local_188,(ulong)(uVar15 - (int)((long)local_130 >> 0x3f)),'-');
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_188._M_dataplus._M_p + -((long)local_130 >> 0x3f),uVar15,uVar20);
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_188,0,0,"Content-Length: ",0x10);
        local_1e8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
        paVar11 = &pbVar8->field_2;
        paVar13 = &local_208.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p == paVar11) {
          local_1e8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_1e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        }
        else {
          local_1e8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        }
        local_1e8._M_string_length = pbVar8->_M_string_length;
        (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar8->_M_string_length = 0;
        (pbVar8->field_2)._M_local_buf[0] = '\0';
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_1e8,"\r\n");
        local_208._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
        paVar11 = &pbVar8->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p == paVar11) {
          local_208.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_208.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
          local_208._M_dataplus._M_p = (pointer)paVar13;
        }
        else {
          local_208.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        }
        local_208._M_string_length = pbVar8->_M_string_length;
        (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar8->_M_string_length = 0;
        (pbVar8->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar13) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_1a8,"Server: LinYa\'s Web Server\r\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_1a8,"\r\n");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&this->outBuffer_,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
        AVar16 = ANALYSIS_SUCCESS;
        if (this->method_ == METHOD_HEAD) goto LAB_0010a2b3;
        iVar5 = open((this_01->_M_dataplus)._M_p,0,0);
        if (iVar5 < 0) {
          (this->outBuffer_)._M_string_length = 0;
          *(this->outBuffer_)._M_dataplus._M_p = '\0';
          iVar5 = this->fd_;
          pHVar18 = (HttpData *)local_90;
          local_90._0_8_ = (element_type *)local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)pHVar18,"Not Found!","");
          handleError(pHVar18,iVar5,0x194,(string *)local_90);
          AVar16 = ANALYSIS_ERROR;
          local_60._0_8_ = local_80._0_8_;
          peVar19 = (element_type *)local_90._0_8_;
          if ((element_type *)local_90._0_8_ == (element_type *)local_80) goto LAB_0010a2b3;
        }
        else {
          pvVar9 = mmap((void *)0x0,local_168,1,2,iVar5,0);
          close(iVar5);
          uVar20 = local_168;
          if (pvVar9 != (void *)0xffffffffffffffff) {
            local_208._M_dataplus._M_p = (pointer)paVar13;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_208,pvVar9,(long)pvVar9 + local_168);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&this->outBuffer_,local_208._M_dataplus._M_p,local_208._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != paVar13) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            munmap(pvVar9,uVar20);
            AVar16 = ANALYSIS_SUCCESS;
            goto LAB_0010a2b3;
          }
          munmap((void *)0xffffffffffffffff,local_168);
          (this->outBuffer_)._M_string_length = 0;
          *(this->outBuffer_)._M_dataplus._M_p = '\0';
          iVar5 = this->fd_;
          pHVar18 = (HttpData *)local_b0;
          local_b0._0_8_ = (element_type *)local_a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)pHVar18,"Not Found!","");
          handleError(pHVar18,iVar5,0x194,(string *)local_b0);
          AVar16 = ANALYSIS_ERROR;
          local_60._0_8_ = local_a0._0_8_;
          peVar19 = (element_type *)local_b0._0_8_;
          if ((element_type *)local_b0._0_8_ == (element_type *)local_a0) goto LAB_0010a2b3;
        }
      }
      AVar16 = ANALYSIS_ERROR;
      operator_delete(peVar19,(ulong)((long)&(((element_type *)local_60._0_8_)->
                                             super_enable_shared_from_this<HttpData>)._M_weak_this.
                                             super___weak_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>.
                                             _M_ptr + 1));
    }
  }
LAB_0010a2b3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,
                    CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                             local_1a8.field_2._M_local_buf[0]) + 1);
  }
  return AVar16;
}

Assistant:

AnalysisState HttpData::analysisRequest() {
  if (method_ == METHOD_POST) {
    // ------------------------------------------------------
    // My CV stitching handler which requires OpenCV library
    // ------------------------------------------------------
    // string header;
    // header += string("HTTP/1.1 200 OK\r\n");
    // if(headers_.find("Connection") != headers_.end() &&
    // headers_["Connection"] == "Keep-Alive")
    // {
    //     keepAlive_ = true;
    //     header += string("Connection: Keep-Alive\r\n") + "Keep-Alive:
    //     timeout=" + to_string(DEFAULT_KEEP_ALIVE_TIME) + "\r\n";
    // }
    // int length = stoi(headers_["Content-length"]);
    // vector<char> data(inBuffer_.begin(), inBuffer_.begin() + length);
    // Mat src = imdecode(data, CV_LOAD_IMAGE_ANYDEPTH|CV_LOAD_IMAGE_ANYCOLOR);
    // //imwrite("receive.bmp", src);
    // Mat res = stitch(src);
    // vector<uchar> data_encode;
    // imencode(".png", res, data_encode);
    // header += string("Content-length: ") + to_string(data_encode.size()) +
    // "\r\n\r\n";
    // outBuffer_ += header + string(data_encode.begin(), data_encode.end());
    // inBuffer_ = inBuffer_.substr(length);
    // return ANALYSIS_SUCCESS;
  } else if (method_ == METHOD_GET || method_ == METHOD_HEAD) {
    string header;
    header += "HTTP/1.1 200 OK\r\n";
    if (headers_.find("Connection") != headers_.end() &&
        (headers_["Connection"] == "Keep-Alive" ||
         headers_["Connection"] == "keep-alive")) {
      keepAlive_ = true;
      header += string("Connection: Keep-Alive\r\n") + "Keep-Alive: timeout=" +
                to_string(DEFAULT_KEEP_ALIVE_TIME) + "\r\n";
    }
    int dot_pos = fileName_.find('.');
    string filetype;
    if (dot_pos < 0)
      filetype = MimeType::getMime("default");
    else
      filetype = MimeType::getMime(fileName_.substr(dot_pos));

    // echo test
    if (fileName_ == "hello") {
      outBuffer_ =
          "HTTP/1.1 200 OK\r\nContent-type: text/plain\r\n\r\nHello World";
      return ANALYSIS_SUCCESS;
    }
    if (fileName_ == "favicon.ico") {
      header += "Content-Type: image/png\r\n";
      header += "Content-Length: " + to_string(sizeof favicon) + "\r\n";
      header += "Server: LinYa's Web Server\r\n";

      header += "\r\n";
      outBuffer_ += header;
      outBuffer_ += string(favicon, favicon + sizeof favicon);
      ;
      return ANALYSIS_SUCCESS;
    }

    struct stat sbuf;
    if (stat(fileName_.c_str(), &sbuf) < 0) {
      header.clear();
      handleError(fd_, 404, "Not Found!");
      return ANALYSIS_ERROR;
    }
    header += "Content-Type: " + filetype + "\r\n";
    header += "Content-Length: " + to_string(sbuf.st_size) + "\r\n";
    header += "Server: LinYa's Web Server\r\n";
    // 头部结束
    header += "\r\n";
    outBuffer_ += header;

    if (method_ == METHOD_HEAD) return ANALYSIS_SUCCESS;

    int src_fd = open(fileName_.c_str(), O_RDONLY, 0);
    if (src_fd < 0) {
      outBuffer_.clear();
      handleError(fd_, 404, "Not Found!");
      return ANALYSIS_ERROR;
    }
    void *mmapRet = mmap(NULL, sbuf.st_size, PROT_READ, MAP_PRIVATE, src_fd, 0);
    close(src_fd);
    if (mmapRet == (void *)-1) {
      munmap(mmapRet, sbuf.st_size);
      outBuffer_.clear();
      handleError(fd_, 404, "Not Found!");
      return ANALYSIS_ERROR;
    }
    char *src_addr = static_cast<char *>(mmapRet);
    outBuffer_ += string(src_addr, src_addr + sbuf.st_size);
    ;
    munmap(mmapRet, sbuf.st_size);
    return ANALYSIS_SUCCESS;
  }
  return ANALYSIS_ERROR;
}